

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::EncodeDecodeTest_DecodeDeterministicOutput_Test::
~EncodeDecodeTest_DecodeDeterministicOutput_Test
          (EncodeDecodeTest_DecodeDeterministicOutput_Test *this)

{
  EncodeDecodeTest_DecodeDeterministicOutput_Test *this_local;
  
  ~EncodeDecodeTest_DecodeDeterministicOutput_Test(this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

TEST_P(EncodeDecodeTest, DecodeDeterministicOutput) {
  std::string golden_path = absl::StrCat(TestTempDir(), "/golden_message");
  WriteGoldenMessage(golden_path);
  RedirectStdinFromFile(golden_path);
  EXPECT_FALSE(
      Run("google/protobuf/unittest.proto"
          " --decode=proto2_unittest.TestAllTypes --deterministic_output"));
  ExpectError("Can only use --deterministic_output with --encode.");
}